

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MersenneTwister.h
# Opt level: O1

void __thiscall MTRand::seed(MTRand *this,uint32 *bigSeed,uint32 seedLength)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint32 *r;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  this->state[0] = 0x12bd6aa;
  uVar10 = 0x12bd6aa;
  lVar6 = 0;
  do {
    uVar10 = (ulong)((int)lVar6 + 1 + ((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965);
    this->state[lVar6 + 1] = uVar10;
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 0x26f);
  uVar10 = 0x270;
  if (0x270 < (int)seedLength) {
    uVar10 = seedLength & 0xffffffff;
  }
  iVar5 = 1;
  uVar12 = 0;
  do {
    uVar13 = (this->state[(long)iVar5 + -1] >> 0x1e ^ this->state[(long)iVar5 + -1]) * 0x19660d ^
             this->state[iVar5];
    this->state[iVar5] = uVar13;
    this->state[iVar5] = (ulong)(uint)((int)uVar13 + (int)bigSeed[uVar12] + (int)uVar12);
    if (iVar5 < 0x26f) {
      iVar5 = iVar5 + 1;
    }
    else {
      this->state[0] = this->state[0x26f];
      iVar5 = 1;
    }
    uVar12 = uVar12 + 1;
    if (seedLength <= uVar12) {
      uVar12 = 0;
    }
    uVar8 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar8;
  } while (uVar8 != 0);
  iVar9 = -0x26f;
  do {
    this->state[iVar5] =
         (ulong)((((uint)(this->state[(long)iVar5 + -1] >> 0x1e) ^
                  (uint)this->state[(long)iVar5 + -1]) * 0x5d588b65 ^ (uint)this->state[iVar5]) -
                iVar5);
    if (iVar5 < 0x26f) {
      iVar5 = iVar5 + 1;
    }
    else {
      this->state[0] = this->state[0x26f];
      iVar5 = 1;
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0);
  this->state[0] = 0x80000000;
  lVar6 = 0;
  do {
    lVar7 = lVar6;
    uVar8 = *(uint *)((long)this->state + lVar7 + 8);
    *(ulong *)((long)this->state + lVar7) =
         (ulong)(-(uVar8 & 1) & 0x9908b0df) ^
         (ulong)((uVar8 & 0x7ffffffe | *(uint *)((long)this->state + lVar7) & 0x80000000) >> 1) ^
         *(ulong *)((long)this->state + lVar7 + 0xc68);
    auVar4 = _DAT_00103030;
    auVar3 = _DAT_00103020;
    auVar2 = _DAT_00103010;
    lVar6 = lVar7 + 8;
  } while ((int)lVar6 != 0x718);
  lVar11 = 0;
  do {
    auVar1 = *(undefined1 (*) [16])((long)this->state + lVar11 * 8 + lVar7 + 0x10);
    auVar14 = auVar1 & auVar3 |
              *(undefined1 (*) [16])((long)this->state + lVar11 * 8 + lVar6) & auVar2;
    auVar15._0_8_ = auVar14._0_8_ >> 1;
    auVar15._8_8_ = auVar14._8_8_ >> 1;
    auVar14._0_4_ = (auVar1._0_4_ << 0x1f) >> 0x1f;
    auVar14._4_4_ = (auVar1._4_4_ << 0x1f) >> 0x1f;
    auVar14._8_4_ = (int)(auVar1._8_4_ << 0x1f) >> 0x1f;
    auVar14._12_4_ = (auVar1._12_4_ << 0x1f) >> 0x1f;
    *(undefined1 (*) [16])((long)this->state + lVar11 * 8 + lVar6) =
         auVar14 & auVar4 ^
         auVar15 ^ *(undefined1 (*) [16])((long)this + lVar11 * 8 + lVar7 + -0x710);
    lVar11 = lVar11 + 2;
  } while (lVar11 != 0x18c);
  uVar8 = (uint)this->state[0];
  *(ulong *)((long)this->state + lVar7 + 0xc68) =
       (ulong)(-(uVar8 & 1) & 0x9908b0df) ^
       (ulong)((uVar8 & 0x7ffffffe | auVar1._8_4_ & 0x80000000) >> 1) ^
       *(ulong *)((long)this->state + lVar7 + 0x550);
  this->left = 0x270;
  this->pNext = this->state;
  return;
}

Assistant:

inline void MTRand::initialize( const uint32 seed )
{
	// Initialize generator state with seed
	// See Knuth TAOCP Vol 2, 3rd Ed, p.106 for multiplier.
	// In previous versions, most significant bits (MSBs) of the seed affect
	// only MSBs of the state array.  Modified 9 Jan 2002 by Makoto Matsumoto.
	register uint32 *s = state;
	register uint32 *r = state;
	register int i = 1;
	*s++ = seed & 0xffffffffUL;
	for( ; i < N; ++i )
	{
		*s++ = ( 1812433253UL * ( *r ^ (*r >> 30) ) + i ) & 0xffffffffUL;
		r++;
	}
}